

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstring.cpp
# Opt level: O0

ArgEscapeData * findArgEscapes(QStringView s)

{
  long lVar1;
  const_iterator pvVar2;
  char16_t cVar3;
  int iVar4;
  const_iterator pvVar5;
  QChar *this;
  const_iterator pvVar6;
  ArgEscapeData *in_RDI;
  long in_FS_OFFSET;
  bool bVar7;
  int next_escape;
  int escape;
  bool locale_arg;
  QChar *escape_start;
  QChar *c;
  QChar *uc_end;
  QChar *uc_begin;
  ArgEscapeData *pAVar8;
  int local_48;
  const_iterator local_38;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  pAVar8 = in_RDI;
  local_38 = QStringView::begin((QStringView *)0x150e90);
  pvVar5 = QStringView::end((QStringView *)in_RDI);
  *(undefined8 *)pAVar8 = 0xaaaaaaaaaaaaaaaa;
  pAVar8->occurrences = -0x5555555555555556;
  pAVar8->locale_occurrences = -0x5555555555555556;
  pAVar8->escape_len = -0x5555555555555556;
  pAVar8->min_escape = 0x7fffffff;
  pAVar8->occurrences = 0;
  pAVar8->escape_len = 0;
  pAVar8->locale_occurrences = 0;
  while (local_38 != pvVar5) {
    while( true ) {
      pvVar2 = local_38;
      bVar7 = false;
      if (local_38 != pvVar5) {
        cVar3 = QChar::unicode(local_38);
        bVar7 = cVar3 != L'%';
      }
      if (!bVar7) break;
      local_38 = local_38 + 1;
    }
    if ((local_38 == pvVar5) || (this = local_38 + 1, this == pvVar5)) break;
    bVar7 = false;
    cVar3 = QChar::unicode(this);
    if (cVar3 == L'L') {
      bVar7 = true;
      this = local_38 + 2;
      if (local_38 + 2 == pvVar5) break;
    }
    local_38 = this;
    local_48 = qArgDigitValue((QChar)(char16_t)((ulong)pAVar8 >> 0x30));
    if (local_48 != -1) {
      pvVar6 = local_38 + 1;
      if ((pvVar6 != pvVar5) &&
         (iVar4 = qArgDigitValue((QChar)(char16_t)((ulong)pAVar8 >> 0x30)), iVar4 != -1)) {
        local_48 = local_48 * 10 + iVar4;
        pvVar6 = local_38 + 2;
      }
      local_38 = pvVar6;
      if (local_48 <= pAVar8->min_escape) {
        if (local_48 < pAVar8->min_escape) {
          pAVar8->min_escape = local_48;
          pAVar8->occurrences = 0;
          pAVar8->escape_len = 0;
          pAVar8->locale_occurrences = 0;
        }
        pAVar8->occurrences = pAVar8->occurrences + 1;
        if (bVar7) {
          pAVar8->locale_occurrences = pAVar8->locale_occurrences + 1;
        }
        pAVar8->escape_len = ((long)local_38 - (long)pvVar2 >> 1) + pAVar8->escape_len;
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return in_RDI;
}

Assistant:

static ArgEscapeData findArgEscapes(QStringView s)
{
    const QChar *uc_begin = s.begin();
    const QChar *uc_end = s.end();

    ArgEscapeData d;

    d.min_escape = INT_MAX;
    d.occurrences = 0;
    d.escape_len = 0;
    d.locale_occurrences = 0;

    const QChar *c = uc_begin;
    while (c != uc_end) {
        while (c != uc_end && c->unicode() != '%')
            ++c;

        if (c == uc_end)
            break;
        const QChar *escape_start = c;
        if (++c == uc_end)
            break;

        bool locale_arg = false;
        if (c->unicode() == 'L') {
            locale_arg = true;
            if (++c == uc_end)
                break;
        }

        int escape = qArgDigitValue(*c);
        if (escape == -1)
            continue;

        // ### Qt 7: do not allow anything but ASCII digits
        // in arg()'s replacements.
#if QT_VERSION <= QT_VERSION_CHECK(7, 0, 0) && !defined(QT_BOOTSTRAPPED)
        const QChar *escapeBegin = c;
        const QChar *escapeEnd = escapeBegin + 1;
#endif

        ++c;

        if (c != uc_end) {
            const int next_escape = qArgDigitValue(*c);
            if (next_escape != -1) {
                escape = (10 * escape) + next_escape;
                ++c;
#if QT_VERSION <= QT_VERSION_CHECK(7, 0, 0) && !defined(QT_BOOTSTRAPPED)
                ++escapeEnd;
#endif
            }
        }

#if QT_VERSION <= QT_VERSION_CHECK(7, 0, 0) && !defined(QT_BOOTSTRAPPED)
        checkArgEscape(QStringView(escapeBegin, escapeEnd));
#endif

        if (escape > d.min_escape)
            continue;

        if (escape < d.min_escape) {
            d.min_escape = escape;
            d.occurrences = 0;
            d.escape_len = 0;
            d.locale_occurrences = 0;
        }

        ++d.occurrences;
        if (locale_arg)
            ++d.locale_occurrences;
        d.escape_len += c - escape_start;
    }
    return d;
}